

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O2

void __thiscall CoreML::ShapeRange::setUpper(ShapeRange *this,RangeValue *val)

{
  bool bVar1;
  ostream *poVar2;
  runtime_error *this_00;
  string asStack_1c8 [32];
  stringstream ss;
  ostream local_198 [376];
  
  bVar1 = isValid(this,val);
  if (bVar1) {
    RangeValue::set(&this->_maximum,val);
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar2 = std::operator<<(local_198,"Invalid setUpper ");
  ::operator<<(poVar2,val);
  poVar2 = std::operator<<(poVar2," for range: ");
  ::operator<<(poVar2,this);
  std::operator<<(poVar2,"\n");
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,asStack_1c8);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ShapeRange::setUpper(const RangeValue& val) {
    if (isValid(val)) {
        _maximum.set(val);
    }
    else {
        std::stringstream ss;
        ss << "Invalid setUpper " << val << " for range: " << *this << "\n";
        throw std::runtime_error(ss.str());
    }
}